

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::MatchHere
          (Matcher *this,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *nextSyncInputOffset,ContStack *contStack,AssertionStack *assertionStack,
          uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  bool firstIteration_local;
  ContStack *contStack_local;
  CharCount *nextSyncInputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *this_local;
  
  ContinuousPageStack<1UL>::Clear((ContinuousPageStack<1UL> *)contStack);
  ContinuousPageStack<1UL>::Clear((ContinuousPageStack<1UL> *)assertionStack);
  bVar2 = ContinuousPageStack<1UL>::IsEmpty((ContinuousPageStack<1UL> *)contStack);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x142a,"(contStack.IsEmpty())","contStack.IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ContinuousPageStack<1UL>::IsEmpty((ContinuousPageStack<1UL> *)assertionStack);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x142b,"(assertionStack.IsEmpty())","assertionStack.IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  ResetInnerGroups(this,0,pPVar4->numGroups - 1);
  ResetLoopInfos(this);
  Run(this,input,inputLength,matchStart,nextSyncInputOffset,contStack,assertionStack,qcTicks,
      firstIteration);
  bVar2 = WasLastMatchSuccessful(this);
  return bVar2;
}

Assistant:

inline bool Matcher::MatchHere(const Char* const input, const CharCount inputLength, CharCount &matchStart, CharCount &nextSyncInputOffset, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks, bool firstIteration)
    {
        // Reset the continuation and assertion stacks ready for fresh run
        // NOTE: We used to do this after the Run, but it's safer to do it here in case unusual control flow exits
        //       the matcher without executing the clears.
        contStack.Clear();
        // assertionStack may be non-empty since we can hard fail directly out of matcher without popping assertion
        assertionStack.Clear();

        Assert(contStack.IsEmpty());
        Assert(assertionStack.IsEmpty());

        ResetInnerGroups(0, program->numGroups - 1);
#if DBG
        ResetLoopInfos();
#endif

        Run(input, inputLength, matchStart, nextSyncInputOffset, contStack, assertionStack, qcTicks, firstIteration);
        // Leave the continuation and assertion stack memory in place so we don't have to alloc next time

        return WasLastMatchSuccessful();
    }